

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

void __thiscall ExternRefSymbol::saveXml(ExternRefSymbol *this,ostream *s)

{
  AddrSpace *pAVar1;
  ostream *poVar2;
  char local_39;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<externrefsymbol",0x10);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"name","");
  local_39 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_39,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  xml_escape(s,(this->super_Symbol).name._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar1 = (this->refaddr).base;
  if (pAVar1 != (AddrSpace *)0x0) {
    (*pAVar1->_vptr_AddrSpace[7])(pAVar1,s,(this->refaddr).offset);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"</externrefsymbol>\n",0x13);
  return;
}

Assistant:

void ExternRefSymbol::saveXml(ostream &s) const

{
  s << "<externrefsymbol";
  a_v(s,"name",name);
  s << ">\n";
  refaddr.saveXml(s);
  s << "</externrefsymbol>\n";
}